

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext(RunContext *this,IConfig *_config,IEventListenerPtr *reporter)

{
  StringRef _name;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  IEventListener *pIVar3;
  ReporterPreferences *pRVar4;
  Context *this_00;
  size_type extraout_RDX;
  byte local_c9;
  IEventListenerPtr *reporter_local;
  IConfig *_config_local;
  RunContext *this_local;
  
  IResultCapture::IResultCapture(&this->super_IResultCapture);
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00500b58;
  iVar1 = (*_config->_vptr_IConfig[3])();
  _name.m_start._4_4_ = extraout_var;
  _name.m_start._0_4_ = iVar1;
  _name.m_size = extraout_RDX;
  TestRunInfo::TestRunInfo(&this->m_runInfo,_name);
  this->m_activeTestCase = (TestCaseHandle *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  Optional<Catch::AssertionResult>::Optional(&this->m_lastResult);
  this->m_config = _config;
  Totals::Totals(&this->m_totals);
  Detail::unique_ptr<Catch::IEventListener>::unique_ptr(&this->m_reporter,reporter);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector(&this->m_messages);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::vector
            (&this->m_messageScopes);
  (this->m_lastAssertionInfo).macroName.m_start = (char *)0x0;
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  StringRef::StringRef(&(this->m_lastAssertionInfo).macroName);
  SourceLineInfo::SourceLineInfo(&(this->m_lastAssertionInfo).lineInfo,"",0);
  (this->m_lastAssertionInfo).capturedExpression.m_start = (char *)0x0;
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  StringRef::StringRef(&(this->m_lastAssertionInfo).capturedExpression);
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::vector
            (&this->m_unfinishedSections);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::vector(&this->m_activeSections);
  TestCaseTracking::TrackerContext::TrackerContext(&this->m_trackerContext);
  FatalConditionHandler::FatalConditionHandler(&this->m_fatalConditionhandler);
  this->m_lastAssertionPassed = false;
  this->m_shouldReportUnexpected = true;
  uVar2 = (*this->m_config->_vptr_IConfig[4])();
  local_c9 = 1;
  if ((uVar2 & 1) == 0) {
    pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(&this->m_reporter);
    pRVar4 = IEventListener::getPreferences(pIVar3);
    local_c9 = pRVar4->shouldReportAllAssertions;
  }
  this->m_includeSuccessfulResults = (bool)(local_c9 & 1);
  this_00 = getCurrentMutableContext();
  Context::setResultCapture(this_00,&this->super_IResultCapture);
  pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(&this->m_reporter);
  (*pIVar3->_vptr_IEventListener[4])(pIVar3,&this->m_runInfo);
  return;
}

Assistant:

RunContext::RunContext(IConfig const* _config, IEventListenerPtr&& reporter)
    :   m_runInfo(_config->name()),
        m_config(_config),
        m_reporter(CATCH_MOVE(reporter)),
        m_lastAssertionInfo{ StringRef(), SourceLineInfo("",0), StringRef(), ResultDisposition::Normal },
        m_includeSuccessfulResults( m_config->includeSuccessfulResults() || m_reporter->getPreferences().shouldReportAllAssertions )
    {
        getCurrentMutableContext().setResultCapture( this );
        m_reporter->testRunStarting(m_runInfo);
    }